

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

bool testing::internal::TypeParameterizedTest<$bc8a167$>::Register
               (char *prefix,CodeLocation *code_location,char *case_name,char *test_names,int index,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *type_names)

{
  bool bVar1;
  char *str;
  char *in_RCX;
  CodeLocation *in_RDX;
  char *in_RSI;
  char *in_RDI;
  int in_R8D;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_R9;
  CodeLocation *in_stack_fffffffffffffe28;
  CodeLocation *in_stack_fffffffffffffe30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe38;
  string *in_stack_fffffffffffffe68;
  int line_num;
  string local_148 [32];
  string local_128 [32];
  string local_108 [16];
  TypeId in_stack_ffffffffffffff08;
  CodeLocation *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff30;
  SetUpTestSuiteFunc in_stack_ffffffffffffff40;
  TearDownTestSuiteFunc in_stack_ffffffffffffff48;
  TestFactoryBase *in_stack_ffffffffffffff50;
  string local_90 [32];
  string local_70 [32];
  string local_50 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffc8;
  int index_00;
  undefined4 in_stack_ffffffffffffffd8;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff30,in_RDI,(allocator *)&stack0xffffffffffffff2f);
  std::operator+(in_stack_fffffffffffffe38,(char *)in_stack_fffffffffffffe30);
  std::operator+(in_stack_fffffffffffffe38,(char *)in_stack_fffffffffffffe30);
  std::operator+(in_stack_fffffffffffffe38,(char *)in_stack_fffffffffffffe30);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](in_R9,(long)in_R8D);
  index_00 = (int)((ulong)in_R9 >> 0x20);
  std::operator+(in_stack_fffffffffffffe38,&in_stack_fffffffffffffe30->file);
  str = (char *)std::__cxx11::string::c_str();
  GetPrefixUntilComma_abi_cxx11_(str);
  line_num = (int)((ulong)str >> 0x20);
  StripTrailingSpaces(in_stack_fffffffffffffe68);
  std::__cxx11::string::c_str();
  GetTypeName<google::HashtableInterface_SparseHashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>>
            ();
  std::__cxx11::string::c_str();
  CodeLocation::CodeLocation(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  GetTypeId<HashtableAllTest<google::HashtableInterface_SparseHashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>>>
            ();
  std::__cxx11::string::c_str();
  SuiteApiResolver<HashtableAllTest_ResizeActuallyResizes_Test<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>_>
  ::GetSetUpCaseOrSuite(in_RDI,line_num);
  std::__cxx11::string::c_str();
  SuiteApiResolver<HashtableAllTest_ResizeActuallyResizes_Test<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>_>
  ::GetTearDownCaseOrSuite(in_RDI,line_num);
  operator_new(8);
  TestFactoryImpl<HashtableAllTest_ResizeActuallyResizes_Test<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>_>
  ::TestFactoryImpl((TestFactoryImpl<HashtableAllTest_ResizeActuallyResizes_Test<google::HashtableInterface_SparseHashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>_>
                     *)in_stack_fffffffffffffe30);
  MakeAndRegisterTestInfo
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
             in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
             in_stack_ffffffffffffff40,in_stack_ffffffffffffff48,in_stack_ffffffffffffff50);
  CodeLocation::~CodeLocation((CodeLocation *)0x102d467);
  std::__cxx11::string::~string(local_148);
  std::__cxx11::string::~string(local_108);
  std::__cxx11::string::~string(local_128);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff50);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff30);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff2f);
  bVar1 = TypeParameterizedTest<HashtableAllTest,_testing::internal::TemplateSel<HashtableAllTest_ResizeActuallyResizes_Test>,_testing::internal::Types<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_google::HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>,_google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_google::HashtableInterface_DenseHashSet<std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>_>
          ::Register(in_RSI,in_RDX,in_RCX,(char *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),
                     index_00,in_stack_ffffffffffffffc8);
  return bVar1;
}

Assistant:

static bool Register(const char* prefix, const CodeLocation& code_location,
                       const char* case_name, const char* test_names, int index,
                       const std::vector<std::string>& type_names =
                           GenerateNames<DefaultNameGenerator, Types>()) {
    typedef typename Types::Head Type;
    typedef Fixture<Type> FixtureClass;
    typedef typename GTEST_BIND_(TestSel, Type) TestClass;

    // First, registers the first type-parameterized test in the type
    // list.
    MakeAndRegisterTestInfo(
        (std::string(prefix) + (prefix[0] == '\0' ? "" : "/") + case_name +
         "/" + type_names[static_cast<size_t>(index)])
            .c_str(),
        StripTrailingSpaces(GetPrefixUntilComma(test_names)).c_str(),
        GetTypeName<Type>().c_str(),
        nullptr,  // No value parameter.
        code_location, GetTypeId<FixtureClass>(),
        SuiteApiResolver<TestClass>::GetSetUpCaseOrSuite(
            code_location.file.c_str(), code_location.line),
        SuiteApiResolver<TestClass>::GetTearDownCaseOrSuite(
            code_location.file.c_str(), code_location.line),
        new TestFactoryImpl<TestClass>);

    // Next, recurses (at compile time) with the tail of the type list.
    return TypeParameterizedTest<Fixture, TestSel,
                                 typename Types::Tail>::Register(prefix,
                                                                 code_location,
                                                                 case_name,
                                                                 test_names,
                                                                 index + 1,
                                                                 type_names);
  }